

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_dstr.c
# Opt level: O0

void setup_append_buf(arg_dstr_t ds,int new_space)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  char *newbuf;
  int total_space;
  int new_space_local;
  arg_dstr_t ds_local;
  
  if (ds->data == ds->append_data) {
    if (ds->data[ds->append_used] != '\0') {
      sVar2 = strlen(ds->data);
      ds->append_used = (int)sVar2;
    }
  }
  else {
    if (500 < ds->append_data_size) {
      argtable3_xfree(ds->append_data);
      ds->append_data = (char *)0x0;
      ds->append_data_size = 0;
    }
    sVar2 = strlen(ds->data);
    ds->append_used = (int)sVar2;
  }
  iVar1 = new_space + ds->append_used;
  if (iVar1 < ds->append_data_size) {
    if (ds->data != ds->append_data) {
      strcpy(ds->append_data,ds->data);
    }
  }
  else {
    if (iVar1 < 100) {
      newbuf._0_4_ = 200;
    }
    else {
      newbuf._0_4_ = iVar1 * 2;
    }
    __dest = (char *)argtable3_xmalloc((ulong)(uint)newbuf);
    memset(__dest,0,(long)(int)(uint)newbuf);
    strcpy(__dest,ds->data);
    if (ds->append_data != (char *)0x0) {
      argtable3_xfree(ds->append_data);
    }
    ds->append_data = __dest;
    ds->append_data_size = (uint)newbuf;
  }
  arg_dstr_free(ds);
  ds->data = ds->append_data;
  return;
}

Assistant:

static void setup_append_buf(arg_dstr_t ds, int new_space) {
    int total_space;

    /*
     * Make the append buffer larger, if that's necessary, then copy the
     * data into the append buffer and make the append buffer the official
     * data.
     */
    if (ds->data != ds->append_data) {
        /*
         * If the buffer is too big, then free it up so we go back to a
         * smaller buffer. This avoids tying up memory forever after a large
         * operation.
         */
        if (ds->append_data_size > 500) {
            xfree(ds->append_data);
            ds->append_data = NULL;
            ds->append_data_size = 0;
        }
        ds->append_used = (int)strlen(ds->data);
    } else if (ds->data[ds->append_used] != 0) {
        /*
         * Most likely someone has modified a result created by
         * arg_dstr_cat et al. so that it has a different size. Just
         * recompute the size.
         */
        ds->append_used = (int)strlen(ds->data);
    }

    total_space = new_space + ds->append_used;
    if (total_space >= ds->append_data_size) {
        char* newbuf;

        if (total_space < 100) {
            total_space = 200;
        } else {
            total_space *= 2;
        }
        newbuf = (char*)xmalloc((unsigned)total_space);
        memset(newbuf, 0, (size_t)total_space);
        strcpy(newbuf, ds->data);
        if (ds->append_data != NULL) {
            xfree(ds->append_data);
        }
        ds->append_data = newbuf;
        ds->append_data_size = total_space;
    } else if (ds->data != ds->append_data) {
        strcpy(ds->append_data, ds->data);
    }

    arg_dstr_free(ds);
    ds->data = ds->append_data;
}